

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcHaig.c
# Opt level: O2

int Abc_NtkHaigCheckTfi_rec(Abc_Obj_t *pNode,Abc_Obj_t *pOld)

{
  int iVar1;
  Abc_Ntk_t *pAVar2;
  Abc_Ntk_t *pAVar3;
  uint uVar4;
  int iVar5;
  int Fill;
  undefined8 in_RDX;
  undefined8 extraout_RDX;
  
  while( true ) {
    if (pNode == (Abc_Obj_t *)0x0) {
      return 0;
    }
    if (pNode == pOld) {
      return 1;
    }
    uVar4 = *(uint *)&pNode->field_0x14 & 0xf;
    if (uVar4 != 7) break;
    pAVar2 = pNode->pNtk;
    iVar5 = pNode->Id;
    Vec_IntFillExtra(&pAVar2->vTravIds,iVar5 + 1,(int)in_RDX);
    if (((long)iVar5 < 0) || ((pAVar2->vTravIds).nSize <= iVar5)) {
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                    ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
    }
    pAVar3 = pNode->pNtk;
    iVar1 = pAVar3->nTravIds;
    if ((pAVar2->vTravIds).pArray[iVar5] == iVar1) {
      return 0;
    }
    iVar5 = pNode->Id;
    Vec_IntFillExtra(&pAVar3->vTravIds,iVar5 + 1,Fill);
    if (((long)iVar5 < 0) || ((pAVar3->vTravIds).nSize <= iVar5)) {
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                    ,0x1c0,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
    }
    (pAVar3->vTravIds).pArray[iVar5] = iVar1;
    iVar5 = Abc_NtkHaigCheckTfi_rec
                      ((Abc_Obj_t *)pNode->pNtk->vObjs->pArray[*(pNode->vFanins).pArray],pOld);
    if (iVar5 != 0) {
      return 1;
    }
    iVar5 = Abc_NtkHaigCheckTfi_rec
                      ((Abc_Obj_t *)pNode->pNtk->vObjs->pArray[(pNode->vFanins).pArray[1]],pOld);
    if (iVar5 != 0) {
      return 1;
    }
    pNode = (Abc_Obj_t *)(pNode->field_5).pData;
    in_RDX = extraout_RDX;
  }
  if (uVar4 == 2) {
    return 0;
  }
  if (uVar4 != 5) {
    __assert_fail("Abc_ObjIsNode(pNode)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcHaig.c"
                  ,0x11d,"int Abc_NtkHaigCheckTfi_rec(Abc_Obj_t *, Abc_Obj_t *)");
  }
  return 0;
}

Assistant:

int Abc_NtkHaigCheckTfi_rec( Abc_Obj_t * pNode, Abc_Obj_t * pOld )
{
    if ( pNode == NULL )
        return 0;
    if ( pNode == pOld )
        return 1;
    // check the trivial cases
    if ( Abc_ObjIsCi(pNode) )
        return 0;
    assert( Abc_ObjIsNode(pNode) );
    // if this node is already visited, skip
    if ( Abc_NodeIsTravIdCurrent( pNode ) )
        return 0;
    // mark the node as visited
    Abc_NodeSetTravIdCurrent( pNode );
    // check the children
    if ( Abc_NtkHaigCheckTfi_rec( Abc_ObjFanin0(pNode), pOld ) )
        return 1;
    if ( Abc_NtkHaigCheckTfi_rec( Abc_ObjFanin1(pNode), pOld ) )
        return 1;
    // check equivalent nodes
    return Abc_NtkHaigCheckTfi_rec( (Abc_Obj_t *)pNode->pData, pOld );
}